

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.capnp.h
# Opt level: O0

void __thiscall capnp::compiler::Token::Builder::setIdentifier(Builder *this,Reader value)

{
  PointerBuilder builder;
  Reader value_00;
  uint uVar1;
  PointerBuilder local_38;
  Builder *local_20;
  Builder *this_local;
  Reader value_local;
  
  value_local.super_StringPtr.content.ptr = value.super_StringPtr.content.size_;
  this_local = value.super_StringPtr.content.ptr;
  local_20 = this;
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::compiler::Token::Which>
            (&this->_builder,uVar1,IDENTIFIER);
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::getPointerField(&local_38,&this->_builder,uVar1);
  value_00.super_StringPtr.content.size_ = (size_t)value_local.super_StringPtr.content.ptr;
  value_00.super_StringPtr.content.ptr = (char *)this_local;
  builder.capTable = local_38.capTable;
  builder.segment = local_38.segment;
  builder.pointer = local_38.pointer;
  capnp::_::PointerHelpers<capnp::Text,_(capnp::Kind)1>::set(builder,value_00);
  return;
}

Assistant:

inline void Token::Builder::setIdentifier( ::capnp::Text::Reader value) {
  _builder.setDataField<Token::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Token::IDENTIFIER);
  ::capnp::_::PointerHelpers< ::capnp::Text>::set(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), value);
}